

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.h
# Opt level: O1

bool __thiscall
btGImpactBvh::boxQuery(btGImpactBvh *this,btAABB *box,btAlignedObjectArray<int> *collided_results)

{
  btScalar *pbVar1;
  float *pfVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  int *piVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  btAABB *pbVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  
  iVar7 = *(int *)this;
  if (0 < iVar7) {
    iVar21 = 0;
    pbVar19 = box;
    do {
      lVar20 = *(long *)(this + 0x18);
      lVar16 = (long)iVar21;
      fVar3 = (box->m_min).m_floats[0];
      pfVar2 = (float *)(lVar20 + 0x10 + lVar16 * 0x24);
      bVar10 = fVar3 == *pfVar2;
      bVar12 = fVar3 < *pfVar2;
      fVar3 = *(float *)(lVar20 + 8 + lVar16 * 0x24);
      pbVar1 = (box->m_max).m_floats + 2;
      bVar11 = fVar3 == *pbVar1;
      bVar13 = fVar3 < *pbVar1;
      uVar4 = *(undefined8 *)(lVar20 + lVar16 * 0x24);
      uVar5 = *(undefined8 *)(lVar20 + 0x14 + lVar16 * 0x24);
      uVar6 = *(undefined8 *)(box->m_max).m_floats;
      auVar14._4_4_ = -(uint)((box->m_min).m_floats[2] <= (float)((ulong)uVar5 >> 0x20));
      auVar14._0_4_ = -(uint)((box->m_min).m_floats[1] <= (float)uVar5);
      auVar14._8_4_ = -(uint)((float)uVar4 <= (float)uVar6);
      auVar14._12_4_ = -(uint)((float)((ulong)uVar4 >> 0x20) <= (float)((ulong)uVar6 >> 0x20));
      iVar17 = movmskps((int)pbVar19,auVar14);
      bVar22 = iVar17 == 0xf;
      pbVar19 = (btAABB *)(ulong)CONCAT31((int3)((uint)iVar17 >> 8),bVar22);
      iVar17 = *(int *)(lVar20 + 0x20 + lVar16 * 0x24);
      if ((-1 < iVar17) && (((bVar13 || bVar11) && (bVar12 || bVar10)) && bVar22)) {
        iVar18 = collided_results->m_size;
        if (iVar18 == collided_results->m_capacity) {
          pbVar19 = (btAABB *)(ulong)(uint)(iVar18 * 2);
          if (iVar18 == 0) {
            pbVar19 = (btAABB *)0x1;
          }
          iVar18 = (int)pbVar19;
          if (collided_results->m_capacity < iVar18) {
            if (iVar18 == 0) {
              piVar15 = (int *)0x0;
            }
            else {
              pbVar19 = (btAABB *)0x10;
              piVar15 = (int *)btAlignedAllocInternal((long)iVar18 << 2,0x10);
            }
            iVar8 = collided_results->m_size;
            if (0 < (long)iVar8) {
              piVar9 = collided_results->m_data;
              lVar20 = 0;
              do {
                pbVar19 = (btAABB *)(ulong)(uint)piVar9[lVar20];
                piVar15[lVar20] = piVar9[lVar20];
                lVar20 = lVar20 + 1;
              } while (iVar8 != lVar20);
            }
            if (collided_results->m_data != (int *)0x0) {
              if (collided_results->m_ownsMemory == true) {
                btAlignedFreeInternal(collided_results->m_data);
              }
              collided_results->m_data = (int *)0x0;
            }
            collided_results->m_ownsMemory = true;
            collided_results->m_data = piVar15;
            collided_results->m_capacity = iVar18;
          }
        }
        collided_results->m_data[collided_results->m_size] = iVar17;
        collided_results->m_size = collided_results->m_size + 1;
      }
      if ((bool)(~(((bVar13 || bVar11) && (bVar12 || bVar10)) && bVar22) & iVar17 < 0)) {
        iVar21 = iVar21 - *(int *)(*(long *)(this + 0x18) + 0x20 + lVar16 * 0x24);
      }
      else {
        iVar21 = iVar21 + 1;
      }
    } while (iVar21 < iVar7);
  }
  return 0 < collided_results->m_size;
}

Assistant:

SIMD_FORCE_INLINE int getNodeCount() const
	{
		return m_num_nodes;
	}